

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O2

bool __thiscall BoxNesting::HopcroftKarpAlgorithm::dfs(HopcroftKarpAlgorithm *this,int16_t vertex)

{
  short vertex_00;
  pointer pvVar1;
  short *psVar2;
  pointer psVar3;
  bool bVar4;
  vector<short,_std::allocator<short>_> *pvVar5;
  short sVar6;
  short *psVar7;
  bool bVar8;
  
  if (vertex == 0) {
    bVar8 = true;
  }
  else {
    pvVar1 = (this->graph).
             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = *(pointer *)
              ((long)&pvVar1[vertex].super__Vector_base<short,_std::allocator<short>_>._M_impl + 8);
    pvVar5 = &this->distances;
    for (psVar7 = *(short **)
                   &pvVar1[vertex].super__Vector_base<short,_std::allocator<short>_>._M_impl;
        bVar8 = psVar7 != psVar2, bVar8; psVar7 = psVar7 + 1) {
      sVar6 = *psVar7;
      psVar3 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start;
      vertex_00 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar6];
      if (psVar3[vertex] + 1 == (int)psVar3[vertex_00]) {
        bVar4 = dfs(this,vertex_00);
        if (bVar4) {
          (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start[sVar6] = vertex;
          pvVar5 = &this->pairsLeft;
          goto LAB_00112d42;
        }
      }
    }
    sVar6 = 0x7fff;
LAB_00112d42:
    (pvVar5->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
    _M_start[vertex] = sVar6;
  }
  return bVar8;
}

Assistant:

bool HopcroftKarpAlgorithm::dfs(int16_t vertex) const
{
	// Path ends if it visits the NILL vertex
	// because we can't traverse anywhere from it
	// It is a shorter path because we we are allready
	// iterating through shorter paths.
	if (vertex == NILL)
	{
		return true;
	}

	for (auto j : this->graph[vertex])
	{ 
		// Follow the distances set by BFS 
		if (this->distances[this->pairsRight[j]] == this->distances[vertex] + 1) 
		{ 
			// If dfs for pair of v also returns 
			// true then it means the path ends at a
			// NILL which means it is the shortest math
			if (dfs(this->pairsRight[j])) 
			{
				// At the matching
				this->pairsRight[j] = vertex;
				this->pairsLeft[vertex] = j;
				return true; 
			} 
		} 
	} 

	// We set distance to infinite here so we can ensure it will
	// not be used in a future path. We allready know this is not
	// the shortest path so it doesn't make sense to check this vertex
	// again.
	this->distances[vertex] = INF; 
	// No paths where found to NILL so it isn't
	// the shortest path
	return false; 
}